

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

MapFieldBase * __thiscall
google::protobuf::Reflection::MutableMapData
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  MapFieldBase *pMVar2;
  
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    pMVar2 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
    return pMVar2;
  }
  anon_unknown_6::ReportReflectionUsageError
            (this->descriptor_,field,"GetMapData","Field is not a map field.");
}

Assistant:

MapFieldBase* Reflection::MutableMapData(Message* message,
                                         const FieldDescriptor* field) const {
  USAGE_CHECK(IsMapFieldInApi(field), GetMapData, "Field is not a map field.");
  return MutableRaw<MapFieldBase>(message, field);
}